

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageDraw(Image *dst,Image src,Rectangle srcRec,Rectangle dstRec,Color tint)

{
  int iVar1;
  int iVar2;
  int format;
  undefined1 auVar3 [16];
  Image image;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Color src_00;
  Color dst_00;
  int iVar8;
  int iVar9;
  int iVar10;
  void *srcPtr;
  Image *__return_storage_ptr__;
  void *srcPtr_00;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  float fVar14;
  float fVar15;
  float fVar16;
  Rectangle rec;
  undefined1 local_b8 [4];
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  void *local_a0;
  void *local_98;
  Image local_48;
  
  iVar1 = src.width;
  iVar2 = src.height;
  fVar12 = dstRec.height;
  fVar13 = dstRec.y;
  fVar16 = srcRec.width;
  fVar11 = srcRec.height;
  fVar15 = srcRec.y;
  if (((dst->data != (void *)0x0) && (dst->width != 0)) &&
     (__return_storage_ptr__ = &src,
     (src.height != 0 && src.width != 0) && (src.data != (void *)0x0 && dst->height != 0))) {
    if (1 < dst->mipmaps) {
      auVar3._8_4_ = in_XMM3_Dc;
      auVar3._0_8_ = dstRec._8_8_;
      auVar3._12_4_ = in_XMM3_Dd;
      unique0x10000188 = auVar3._1_15_;
      TraceLog(4,"Image drawing only applied to base mipmap level");
    }
    fVar14 = srcRec.x;
    if (10 < dst->format) {
      TraceLog(4,"Image drawing not supported for compressed formats");
      return;
    }
    local_48.data = (void *)0x0;
    local_48.width = 0;
    local_48.height = 0;
    local_48.mipmaps = 0;
    local_48.format = 0;
    if (fVar14 < 0.0) {
      fVar16 = fVar14 + fVar16;
      fVar14 = 0.0;
    }
    if (fVar15 < 0.0) {
      fVar11 = fVar15 + fVar11;
      fVar15 = 0.0;
    }
    if ((float)iVar1 < fVar14 + fVar16) {
      fVar16 = (float)iVar1 - fVar14;
    }
    if ((float)iVar2 < fVar15 + fVar11) {
      fVar11 = (float)iVar2 - fVar15;
    }
    if (((int)fVar16 == (int)dstRec.width) && ((int)fVar11 == (int)fVar12)) {
      bVar4 = false;
    }
    else {
      image.height = src.height;
      image.width = src.width;
      __return_storage_ptr__ = &local_48;
      fStack_b4 = fVar12;
      local_b8 = (undefined1  [4])fVar12;
      fStack_b0 = fVar12;
      fStack_ac = fVar12;
      image.data = src.data;
      image.mipmaps = src.mipmaps;
      image.format = src.format;
      rec.y = fVar15;
      rec.x = fVar14;
      rec.height = fVar11;
      rec.width = fVar16;
      ImageFromImage(__return_storage_ptr__,image,rec);
      ImageResize(__return_storage_ptr__,(int)dstRec.width,(int)fVar12);
      fVar16 = (float)local_48.width;
      fVar11 = (float)local_48.height;
      fVar14 = 0.0;
      fVar15 = 0.0;
      bVar4 = true;
    }
    fVar12 = dstRec.x;
    if (0.0 <= fVar12) {
      if ((float)dst->width < fVar16 + fVar12) {
        fVar16 = (float)dst->width - fVar12;
      }
    }
    else {
      fVar14 = -fVar12;
      fVar16 = fVar16 + fVar12;
      fVar12 = 0.0;
    }
    if (0.0 <= fVar13) {
      if ((float)dst->height < fVar13 + fVar11) {
        fVar11 = (float)dst->height - fVar13;
      }
    }
    else {
      fVar15 = -fVar13;
      fVar11 = fVar13 + fVar11;
      fVar13 = 0.0;
    }
    iVar1 = dst->width;
    if ((float)iVar1 < fVar16) {
      fVar16 = (float)iVar1;
    }
    if ((float)dst->height < fVar11) {
      fVar11 = (float)dst->height;
    }
    local_b8[0] = 1;
    if ((0xfeffffff < (uint)tint) && ((uint)__return_storage_ptr__->format < 5)) {
      local_b8[0] = 5 >> ((byte)__return_storage_ptr__->format & 0x1f);
    }
    if (0 < (int)fVar11) {
      iVar2 = __return_storage_ptr__->format;
      local_98 = dst->data;
      iVar5 = GetPixelDataSize(iVar1,1,dst->format);
      local_98 = (void *)((long)(((int)fVar13 * iVar1 + (int)fVar12) * (iVar5 / iVar1)) +
                         (long)local_98);
      local_a0 = __return_storage_ptr__->data;
      iVar8 = __return_storage_ptr__->width;
      iVar6 = GetPixelDataSize(iVar8,1,iVar2);
      iVar7 = iVar6 / iVar8;
      iVar10 = (int)fVar16;
      local_a0 = (void *)((long)(((int)fVar15 * iVar8 + (int)fVar14) * iVar7) + (long)local_a0);
      iVar8 = 0;
      do {
        if (((_local_b8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && (iVar2 == dst->format)
           ) {
          memcpy(local_98,local_a0,(long)(iVar7 * iVar10));
        }
        else {
          srcPtr = local_98;
          srcPtr_00 = local_a0;
          iVar9 = iVar10;
          if (0 < iVar10) {
            do {
              src_00 = GetPixelColor(srcPtr_00,iVar2);
              format = dst->format;
              if ((_local_b8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                dst_00 = GetPixelColor(srcPtr,format);
                src_00 = ColorAlphaBlend(dst_00,src_00,tint);
              }
              SetPixelColor(srcPtr,src_00,format);
              iVar9 = iVar9 + -1;
              srcPtr = (void *)((long)srcPtr + (long)(iVar5 / iVar1));
              srcPtr_00 = (void *)((long)srcPtr_00 + (long)iVar7);
            } while (iVar9 != 0);
          }
        }
        local_a0 = (void *)((long)local_a0 + (long)iVar6);
        local_98 = (void *)((long)local_98 + (long)iVar5);
        iVar8 = iVar8 + 1;
      } while (iVar8 != (int)fVar11);
    }
    if (bVar4) {
      free(local_48.data);
    }
  }
  return;
}

Assistant:

void ImageDraw(Image *dst, Image src, Rectangle srcRec, Rectangle dstRec, Color tint)
{
    // Security check to avoid program crash
    if ((dst->data == NULL) || (dst->width == 0) || (dst->height == 0) ||
        (src.data == NULL) || (src.width == 0) || (src.height == 0)) return;

    if (dst->mipmaps > 1) TRACELOG(LOG_WARNING, "Image drawing only applied to base mipmap level");
    if (dst->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image drawing not supported for compressed formats");
    else
    {
        Image srcMod = { 0 };       // Source copy (in case it was required)
        Image *srcPtr = &src;       // Pointer to source image
        bool useSrcMod = false;     // Track source copy required

        // Source rectangle out-of-bounds security checks
        if (srcRec.x < 0) { srcRec.width += srcRec.x; srcRec.x = 0; }
        if (srcRec.y < 0) { srcRec.height += srcRec.y; srcRec.y = 0; }
        if ((srcRec.x + srcRec.width) > src.width) srcRec.width = src.width - srcRec.x;
        if ((srcRec.y + srcRec.height) > src.height) srcRec.height = src.height - srcRec.y;

        // Check if source rectangle needs to be resized to destination rectangle
        // In that case, we make a copy of source and we apply all required transform
        if (((int)srcRec.width != (int)dstRec.width) || ((int)srcRec.height != (int)dstRec.height))
        {
            srcMod = ImageFromImage(src, srcRec);   // Create image from another image
            ImageResize(&srcMod, (int)dstRec.width, (int)dstRec.height);   // Resize to destination rectangle
            srcRec = (Rectangle){ 0, 0, (float)srcMod.width, (float)srcMod.height };

            srcPtr = &srcMod;
            useSrcMod = true;
        }

        // Destination rectangle out-of-bounds security checks
        if (dstRec.x < 0)
        {
            srcRec.x = -dstRec.x;
            srcRec.width += dstRec.x;
            dstRec.x = 0;
        }
        else if ((dstRec.x + srcRec.width) > dst->width) srcRec.width = dst->width - dstRec.x;

        if (dstRec.y < 0)
        {
            srcRec.y = -dstRec.y;
            srcRec.height += dstRec.y;
            dstRec.y = 0;
        }
        else if ((dstRec.y + srcRec.height) > dst->height) srcRec.height = dst->height - dstRec.y;

        if (dst->width < srcRec.width) srcRec.width = (float)dst->width;
        if (dst->height < srcRec.height) srcRec.height = (float)dst->height;

        // This blitting method is quite fast! The process followed is:
        // for every pixel -> [get_src_format/get_dst_format -> blend -> format_to_dst]
        // Some optimization ideas:
        //    [x] Avoid creating source copy if not required (no resize required)
        //    [x] Optimize ImageResize() for pixel format (alternative: ImageResizeNN())
        //    [x] Optimize ColorAlphaBlend() to avoid processing (alpha = 0) and (alpha = 1)
        //    [x] Optimize ColorAlphaBlend() for faster operations (maybe avoiding divs?)
        //    [x] Consider fast path: no alpha blending required cases (src has no alpha)
        //    [x] Consider fast path: same src/dst format with no alpha -> direct line copy
        //    [-] GetPixelColor(): Return Vector4 instead of Color, easier for ColorAlphaBlend()

        Color colSrc, colDst, blend;
        bool blendRequired = true;

        // Fast path: Avoid blend if source has no alpha to blend
        if ((tint.a == 255) && ((srcPtr->format == PIXELFORMAT_UNCOMPRESSED_GRAYSCALE) || (srcPtr->format == PIXELFORMAT_UNCOMPRESSED_R8G8B8) || (srcPtr->format == PIXELFORMAT_UNCOMPRESSED_R5G6B5))) blendRequired = false;

        int strideDst = GetPixelDataSize(dst->width, 1, dst->format);
        int bytesPerPixelDst = strideDst/(dst->width);

        int strideSrc = GetPixelDataSize(srcPtr->width, 1, srcPtr->format);
        int bytesPerPixelSrc = strideSrc/(srcPtr->width);

        unsigned char *pSrcBase = (unsigned char *)srcPtr->data + ((int)srcRec.y*srcPtr->width + (int)srcRec.x)*bytesPerPixelSrc;
        unsigned char *pDstBase = (unsigned char *)dst->data + ((int)dstRec.y*dst->width + (int)dstRec.x)*bytesPerPixelDst;

        for (int y = 0; y < (int)srcRec.height; y++)
        {
            unsigned char *pSrc = pSrcBase;
            unsigned char *pDst = pDstBase;

            // Fast path: Avoid moving pixel by pixel if no blend required and same format
            if (!blendRequired && (srcPtr->format == dst->format)) memcpy(pDst, pSrc, (int)(srcRec.width)*bytesPerPixelSrc);
            else
            {
                for (int x = 0; x < (int)srcRec.width; x++)
                {
                    colSrc = GetPixelColor(pSrc, srcPtr->format);
                    colDst = GetPixelColor(pDst, dst->format);

                    // Fast path: Avoid blend if source has no alpha to blend
                    if (blendRequired) blend = ColorAlphaBlend(colDst, colSrc, tint);
                    else blend = colSrc;

                    SetPixelColor(pDst, blend, dst->format);

                    pDst += bytesPerPixelDst;
                    pSrc += bytesPerPixelSrc;
                }
            }

            pSrcBase += strideSrc;
            pDstBase += strideDst;
        }

        if (useSrcMod) UnloadImage(srcMod);     // Unload source modified image
    }
}